

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SMPTEAnalyzerResults::GenerateFrameTabularText
          (SMPTEAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  Frame frame;
  char str [128];
  Frame local_e8 [40];
  Frame local_c0 [40];
  char local_98 [136];
  
  AnalyzerResults::GetFrame((ulonglong)local_c0);
  Frame::Frame(local_e8,local_c0);
  fillSMPTE(this,local_e8,local_98);
  Frame::~Frame(local_e8);
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::AddTabularText
            ((char *)this,local_98,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(local_c0);
  return;
}

Assistant:

void SMPTEAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
	Frame frame = GetFrame( frame_index );
	char str[128];
	fillSMPTE(frame,str);

	ClearTabularText();
	AddTabularText( str );
}